

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenTypePointer_abi_cxx11_
          (string *__return_storage_ptr__,KotlinKMPGenerator *this,Type *type)

{
  BaseType BVar1;
  StructDef *def;
  char *__s;
  allocator<char> local_41;
  undefined1 local_40 [32];
  
  BVar1 = type->base_type;
  if (BVar1 == BASE_TYPE_STRUCT) {
    def = type->struct_def;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"",&local_41);
    TypeInNameSpace(__return_storage_ptr__,this,&def->super_Definition,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  else if (BVar1 == BASE_TYPE_VECTOR) {
    local_40._0_4_ = type->element;
    local_40._24_2_ = type->fixed_length;
    local_40._4_4_ = BASE_TYPE_NONE;
    local_40._8_8_ = type->struct_def;
    local_40._16_8_ = type->enum_def;
    GenTypeGet_abi_cxx11_(__return_storage_ptr__,this,(Type *)local_40);
  }
  else {
    if (BVar1 == BASE_TYPE_STRING) {
      __s = "String";
    }
    else {
      __s = "Table";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypePointer(const Type &type) const {
    switch (type.base_type) {
      case BASE_TYPE_STRING: return "String";
      case BASE_TYPE_VECTOR: return GenTypeGet(type.VectorType());
      case BASE_TYPE_STRUCT: return TypeInNameSpace(*type.struct_def);
      default: return "Table";
    }
  }